

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriterState<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
StandardColumnWriterState
          (StandardColumnWriterState<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>
           *this,ParquetWriter *writer,RowGroup *row_group,idx_t col_idx)

{
  ClientContext *pCVar1;
  RowGroup *in_RCX;
  ParquetWriter *in_RDX;
  ParquetWriter *in_RSI;
  Allocator *in_RDI;
  PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *unaff_retaddr
  ;
  idx_t in_stack_ffffffffffffffd8;
  Allocator *allocator_p;
  
  allocator_p = in_RDI;
  PrimitiveColumnWriterState::PrimitiveColumnWriterState
            ((PrimitiveColumnWriterState *)in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__StandardColumnWriterState_00bfd430;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined4 *)(in_RDI + 0xe0) = 0;
  pCVar1 = ParquetWriter::GetContext(in_RSI);
  duckdb::BufferAllocator::Get(pCVar1);
  ParquetWriter::DictionarySizeLimit(in_RSI);
  ParquetWriter::StringDictionaryPageSizeLimit(in_RSI);
  PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
  PrimitiveDictionary(unaff_retaddr,allocator_p,(idx_t)in_RSI,(idx_t)in_RDX);
  *(undefined4 *)(in_RDI + 0x188) = 0;
  return;
}

Assistant:

StandardColumnWriterState(ParquetWriter &writer, duckdb_parquet::RowGroup &row_group, idx_t col_idx)
	    : PrimitiveColumnWriterState(writer, row_group, col_idx),
	      dictionary(BufferAllocator::Get(writer.GetContext()), writer.DictionarySizeLimit(),
	                 writer.StringDictionaryPageSizeLimit()),
	      encoding(duckdb_parquet::Encoding::PLAIN) {
	}